

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.h
# Opt level: O3

void __thiscall
YAML::EmitterState::_Set<unsigned_long>
          (EmitterState *this,Setting<unsigned_long> *fmt,unsigned_long value,value scope)

{
  pointer *__ptr;
  _Head_base<0UL,_YAML::SettingChangeBase_*,_false> _Var1;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> pChange_1;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> pChange;
  __uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_28;
  __uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_20;
  
  if (scope == Global) {
    fmt->m_value = value;
    local_28._M_t.
    super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
    .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         (tuple<YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
         operator_new(0x18);
    *(undefined ***)
     local_28._M_t.
     super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
     .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         &PTR__SettingChangeBase_00877950;
    ((SettingChangeBase *)
    ((long)local_28._M_t.
           super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
           .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 8))->
    _vptr_SettingChangeBase = (_func_int **)fmt;
    ((SettingChangeBase *)
    ((long)local_28._M_t.
           super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
           .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 0x10))->
    _vptr_SettingChangeBase = (_func_int **)value;
    fmt->m_value = value;
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
    ::
    emplace_back<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>
              ((vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
                *)&this->m_globalModifiedSettings,
               (unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *
               )&local_28);
    _Var1._M_head_impl =
         (SettingChangeBase *)
         local_28._M_t.
         super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
         .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl;
  }
  else {
    if (scope != Local) {
      return;
    }
    local_20._M_t.
    super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
    .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         (tuple<YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
         operator_new(0x18);
    *(undefined ***)
     local_20._M_t.
     super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
     .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         &PTR__SettingChangeBase_00877950;
    ((SettingChangeBase *)
    ((long)local_20._M_t.
           super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
           .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 8))->
    _vptr_SettingChangeBase = (_func_int **)fmt;
    ((SettingChangeBase *)
    ((long)local_20._M_t.
           super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
           .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 0x10))->
    _vptr_SettingChangeBase = (_func_int **)fmt->m_value;
    fmt->m_value = value;
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
    ::
    emplace_back<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>
              ((vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
                *)&this->m_modifiedSettings,
               (unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *
               )&local_20);
    _Var1._M_head_impl =
         (SettingChangeBase *)
         local_20._M_t.
         super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
         .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl;
  }
  if ((_Head_base<0UL,_YAML::SettingChangeBase_*,_false>)_Var1._M_head_impl !=
      (_Head_base<0UL,_YAML::SettingChangeBase_*,_false>)0x0) {
    (*(_Var1._M_head_impl)->_vptr_SettingChangeBase[1])();
  }
  return;
}

Assistant:

void EmitterState::_Set(Setting<T>& fmt, T value, FmtScope::value scope) {
  switch (scope) {
    case FmtScope::Local:
      m_modifiedSettings.push(fmt.set(value));
      break;
    case FmtScope::Global:
      fmt.set(value);
      m_globalModifiedSettings.push(
          fmt.set(value));  // this pushes an identity set, so when we restore,
      // it restores to the value here, and not the previous one
      break;
    default:
      assert(false);
  }
}